

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac_next_cuesheet_track
                    (ma_dr_flac_cuesheet_track_iterator *pIter,
                    ma_dr_flac_cuesheet_track *pCuesheetTrack)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  undefined4 uVar4;
  ulong *puVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  ma_bool32 mVar9;
  ulong uVar10;
  
  mVar9 = 0;
  if (((pIter != (ma_dr_flac_cuesheet_track_iterator *)0x0) &&
      (mVar9 = 0, pIter->countRemaining != 0)) &&
     (puVar5 = (ulong *)pIter->pRunningData, mVar9 = 0, puVar5 != (ulong *)0x0)) {
    uVar3 = *(uint *)((long)puVar5 + 4);
    uVar7 = *puVar5;
    uVar8 = puVar5[1];
    uVar4 = *(undefined4 *)((long)puVar5 + 0x11);
    uVar6 = *(undefined8 *)((long)puVar5 + 9);
    bVar1 = *(byte *)((long)puVar5 + 0x15);
    bVar2 = *(byte *)((long)puVar5 + 0x23);
    pIter->pRunningData = (char *)((long)puVar5 + (ulong)bVar2 * 0x10 + 0x24);
    pIter->countRemaining = pIter->countRemaining - 1;
    mVar9 = 1;
    if (pCuesheetTrack != (ma_dr_flac_cuesheet_track *)0x0) {
      uVar10 = (ulong)uVar3 << 0x20;
      pCuesheetTrack->offset =
           uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18
           | (uVar10 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
           (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      pCuesheetTrack->trackNumber = (ma_uint8)uVar8;
      *(undefined8 *)pCuesheetTrack->ISRC = uVar6;
      *(undefined4 *)(pCuesheetTrack->ISRC + 8) = uVar4;
      pCuesheetTrack->isAudio = bVar1 >> 7;
      pCuesheetTrack->preEmphasis = bVar1 >> 6 & 1;
      pCuesheetTrack->indexCount = bVar2;
      pCuesheetTrack->pIndexPoints = (ma_dr_flac_cuesheet_track_index *)((long)puVar5 + 0x24);
    }
  }
  return mVar9;
}

Assistant:

MA_API ma_bool32 ma_dr_flac_next_cuesheet_track(ma_dr_flac_cuesheet_track_iterator* pIter, ma_dr_flac_cuesheet_track* pCuesheetTrack)
{
    ma_dr_flac_cuesheet_track cuesheetTrack;
    const char* pRunningData;
    ma_uint64 offsetHi;
    ma_uint64 offsetLo;
    if (pIter == NULL || pIter->countRemaining == 0 || pIter->pRunningData == NULL) {
        return MA_FALSE;
    }
    pRunningData = pIter->pRunningData;
    offsetHi                   = ma_dr_flac__be2host_32(*(const ma_uint32*)pRunningData); pRunningData += 4;
    offsetLo                   = ma_dr_flac__be2host_32(*(const ma_uint32*)pRunningData); pRunningData += 4;
    cuesheetTrack.offset       = offsetLo | (offsetHi << 32);
    cuesheetTrack.trackNumber  = pRunningData[0];                                         pRunningData += 1;
    MA_DR_FLAC_COPY_MEMORY(cuesheetTrack.ISRC, pRunningData, sizeof(cuesheetTrack.ISRC));     pRunningData += 12;
    cuesheetTrack.isAudio      = (pRunningData[0] & 0x80) != 0;
    cuesheetTrack.preEmphasis  = (pRunningData[0] & 0x40) != 0;                           pRunningData += 14;
    cuesheetTrack.indexCount   = pRunningData[0];                                         pRunningData += 1;
    cuesheetTrack.pIndexPoints = (const ma_dr_flac_cuesheet_track_index*)pRunningData;        pRunningData += cuesheetTrack.indexCount * sizeof(ma_dr_flac_cuesheet_track_index);
    pIter->pRunningData = pRunningData;
    pIter->countRemaining -= 1;
    if (pCuesheetTrack) {
        *pCuesheetTrack = cuesheetTrack;
    }
    return MA_TRUE;
}